

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O3

void __thiscall mnf::Point::Point(Point *this,ConstSubPoint *other)

{
  Manifold *M;
  double *local_60;
  long local_58;
  ConstRefVec local_48;
  
  ConstSubPoint::value(&local_48,other);
  PointMemory::PointMemory(&this->super_PointMemory,&local_48);
  free(local_48.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  this->_vptr_Point = (_func_int **)&PTR_format_0013e948;
  M = other->manifold_;
  PointMemory::getMem(&this->super_PointMemory);
  local_60 = (this->super_PointMemory).mem_.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  local_58 = (this->super_PointMemory).mem_.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if (-1 < local_58 || local_60 == (double *)0x0) {
    SubPoint::SubPoint(&this->super_SubPoint,M,(RefVec *)&local_60);
    this->_vptr_Point = (_func_int **)&PTR_format_0013e948;
    return;
  }
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 0]"
               );
}

Assistant:

Point::Point(const ConstSubPoint& other)
    : PointMemory(other.value()), SubPoint(other.getManifold(), getMem())
{
}